

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lalr.c
# Opt level: O1

void compute_lookaheads(void)

{
  int iVar1;
  shorts *psVar2;
  int iVar3;
  shorts **ppsVar4;
  uint *puVar5;
  long lVar6;
  long lVar7;
  uint *puVar8;
  long lVar9;
  shorts *psVar10;
  uint *puVar11;
  uint *puVar12;
  
  puVar5 = F;
  ppsVar4 = lookback;
  iVar1 = lookaheads[nstates];
  lVar7 = (long)iVar1;
  if (0 < lVar7) {
    lVar6 = 0;
    puVar8 = LA;
    do {
      iVar3 = tokensetsize;
      lVar9 = (long)tokensetsize;
      for (psVar10 = ppsVar4[lVar6]; psVar10 != (shorts *)0x0; psVar10 = psVar10->next) {
        if (0 < iVar3) {
          puVar11 = puVar5 + (long)tokensetsize * (long)psVar10->value;
          puVar12 = puVar8;
          do {
            *puVar12 = *puVar12 | *puVar11;
            puVar11 = puVar11 + 1;
            puVar12 = puVar12 + 1;
          } while (puVar12 < puVar8 + lVar9);
        }
      }
      lVar6 = lVar6 + 1;
      puVar8 = puVar8 + lVar9;
    } while (lVar6 != lVar7);
  }
  if (0 < iVar1) {
    lVar6 = 0;
    do {
      psVar10 = lookback[lVar6];
      while (psVar10 != (shorts *)0x0) {
        psVar2 = psVar10->next;
        free(psVar10);
        psVar10 = psVar2;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != lVar7);
  }
  free(lookback);
  free(F);
  return;
}

Assistant:

void compute_lookaheads()
{
  register int i, n;
  register unsigned *fp1, *fp2, *fp3;
  register shorts *sp, *next;
  register unsigned *rowp;

  rowp = LA;
  n = lookaheads[nstates];
  for (i = 0; i < n; i++)
    {
      fp3 = rowp + tokensetsize;
      for (sp = lookback[i]; sp; sp = sp->next)
	{
	  fp1 = rowp;
	  fp2 = F + tokensetsize * sp->value;
	  while (fp1 < fp3)
	    *fp1++ |= *fp2++;
	}
      rowp = fp3;
    }

  for (i = 0; i < n; i++)
    for (sp = lookback[i]; sp; sp = next)
      {
        next = sp->next;
        FREE(sp);
      }

  FREE(lookback);
  FREE(F);
}